

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O0

IterateResult __thiscall gl4cts::TextureViewTestCoherency::iterate(TextureViewTestCoherency *this)

{
  _texture_type texture_type_00;
  bool bVar1;
  ContextInfo *this_00;
  NotSupportedError *this_01;
  uint local_58;
  _texture_type texture_type;
  uint n_texture_type;
  uint n_texture_types;
  _texture_type texture_types [2];
  allocator<char> local_31;
  string local_30;
  TextureViewTestCoherency *local_10;
  TextureViewTestCoherency *this_local;
  
  local_10 = this;
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  bVar1 = glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_texture_view");
  if (!bVar1) {
    texture_types[0]._3_1_ = 1;
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"GL_ARB_texture_view is not supported.",&local_31);
    tcu::NotSupportedError::NotSupportedError(this_01,&local_30);
    texture_types[0]._3_1_ = TEXTURE_TYPE_PARENT_TEXTURE >> 0x18;
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  initBufferObjects(this);
  initPrograms(this);
  initTextures(this);
  initFBO(this);
  initVAO(this);
  _n_texture_type = 0x100000000;
  for (local_58 = 0; local_58 < 2; local_58 = local_58 + 1) {
    texture_type_00 = (&n_texture_type)[local_58];
    checkAPICallCoherency(this,texture_type_00,true);
    checkAPICallCoherency(this,texture_type_00,false);
    checkProgramWriteCoherency
              (this,texture_type_00,false,BARRIER_TYPE_NONE,VERIFICATION_MEAN_PROGRAM);
    if ((this->m_are_images_supported & 1U) != 0) {
      checkProgramWriteCoherency
                (this,texture_type_00,true,BARRIER_TYPE_TEXTURE_FETCH_BARRIER_BIT,
                 VERIFICATION_MEAN_PROGRAM);
      checkProgramWriteCoherency
                (this,texture_type_00,true,BARRIER_TYPE_TEXTURE_UPDATE_BUFFER_BIT,
                 VERIFICATION_MEAN_GLGETTEXIMAGE);
    }
    initTextureContents(this);
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult TextureViewTestCoherency::iterate()
{
	/* Do not execute the test if GL_ARB_texture_view is not supported */
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_texture_view"))
	{
		throw tcu::NotSupportedError("GL_ARB_texture_view is not supported.");
	}

	/* Initialize all GL objects required to run the test */
	initBufferObjects();
	initPrograms();
	initTextures();
	initFBO();
	initVAO();

	/* Iterate over the set of texture types we are to test */
	const _texture_type texture_types[] = { TEXTURE_TYPE_PARENT_TEXTURE, TEXTURE_TYPE_TEXTURE_VIEW };
	const unsigned int  n_texture_types = sizeof(texture_types) / sizeof(texture_types[0]);

	for (unsigned int n_texture_type = 0; n_texture_type < n_texture_types; ++n_texture_type)
	{
		_texture_type texture_type = texture_types[n_texture_type];

		/* Verify parent texture/view coherency when using glTexSubImage2D() */
		checkAPICallCoherency(texture_type, true);

		/* Verify parent texture/view coherency when using glBlitFramebuffer() */
		checkAPICallCoherency(texture_type, false);

		/* Verify parent texture/view coherency when modifying contents of one
		 * of the objects in a program, and then reading the sibling from another
		 * program.
		 */
		checkProgramWriteCoherency(texture_type, false, /* should_use_images */
								   BARRIER_TYPE_NONE, VERIFICATION_MEAN_PROGRAM);

		if (m_are_images_supported)
		{
			/* Verify a view bound to an image unit and written to using image uniforms
			 * in vertex shader stage can later be sampled correctly, assuming
			 * a GL_TEXTURE_FETCH_BARRIER_BIT barrier is inserted between the write
			 * operations and sampling from another program object.
			 */
			checkProgramWriteCoherency(texture_type, true, /* should_use_images */
									   BARRIER_TYPE_TEXTURE_FETCH_BARRIER_BIT, VERIFICATION_MEAN_PROGRAM);

			/* Verify a view bound to an image unit and written to using image uniforms
			 * in vertex shader stage can later be correctly retrieved using a glGetTexImage()
			 * call, assuming a GL_TEXTURE_UPDATE_BARRIER_BIT barrier is inserted between the
			 * two operations.
			 **/
			checkProgramWriteCoherency(texture_type, true, /* should_use_images */
									   BARRIER_TYPE_TEXTURE_UPDATE_BUFFER_BIT, VERIFICATION_MEAN_GLGETTEXIMAGE);
		}

		/* Reinitialize all texture contents */
		initTextureContents();
	} /* for (all read sources) */

	/* Test case passed */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}